

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void __thiscall amrex::ParmParse::get(ParmParse *this,char *name,double *ptr,int ival)

{
  Table *table;
  allocator local_69;
  string local_68;
  string local_48;
  
  table = this->m_table;
  std::__cxx11::string::string((string *)&local_48,name,&local_69);
  prefixedName(&local_68,this,&local_48);
  anon_unknown_12::anon_unknown_0::sgetval<double>(table,&local_68,ptr,ival,-1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void
ParmParse::get (const char* name,
                double&     ptr,
                int         ival) const
{
    sgetval(m_table, prefixedName(name),ptr,ival, LAST);
}